

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmaturePopulate.cpp
# Opt level: O2

bool Assimp::ArmaturePopulate::IsBoneNode
               (aiString *bone_name,vector<aiBone_*,_std::allocator<aiBone_*>_> *bones)

{
  pointer ppaVar1;
  pointer ppaVar2;
  bool bVar3;
  pointer ppaVar4;
  
  ppaVar1 = (bones->super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  ppaVar2 = (bones->super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  do {
    ppaVar4 = ppaVar2;
    if (ppaVar4 == ppaVar1) break;
    bVar3 = aiString::operator==(&(*ppaVar4)->mName,bone_name);
    ppaVar2 = ppaVar4 + 1;
  } while (!bVar3);
  return ppaVar4 != ppaVar1;
}

Assistant:

bool ArmaturePopulate::IsBoneNode(const aiString &bone_name,
                                  std::vector<aiBone *> &bones) {
  for (aiBone *bone : bones) {
    if (bone->mName == bone_name) {
      return true;
    }
  }

  return false;
}